

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadPrimAttrIdentifier(AsciiParser *this,string *token)

{
  int *piVar1;
  char cVar2;
  StreamReader *pSVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator local_3b9;
  string tok;
  char c;
  string *local_378;
  string local_370;
  string local_350;
  ostringstream ss_e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  stringstream ss;
  ostream local_1a8 [376];
  
  local_378 = token;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  while( true ) {
    bVar4 = Eof(this);
    if (bVar4) break;
    bVar4 = Char1(this,&c);
    if (!bVar4) goto LAB_002b1426;
    if (c == '.') {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_dispose();
      if (local_328 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReadPrimAttrIdentifier");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x605);
        ::std::operator<<(poVar6," ");
        pcVar9 = "PrimAttr name must not starts with `.`";
        goto LAB_002b13df;
      }
    }
    else if (c != '_') {
      if (c == ':') {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_dispose();
        if (local_328 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReadPrimAttrIdentifier");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x600);
          ::std::operator<<(poVar6," ");
          pcVar9 = "PrimAttr name must not starts with `:`";
          goto LAB_002b13df;
        }
      }
      else {
        iVar5 = isalnum((int)c);
        if (iVar5 == 0) {
          pSVar3 = this->_sr;
          if ((0 < (long)pSVar3->idx_) && (uVar8 = pSVar3->idx_ - 1, uVar8 <= pSVar3->length_)) {
            pSVar3->idx_ = uVar8;
          }
          break;
        }
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_dispose();
        if (local_328 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          iVar5 = isalpha((int)c);
          if (iVar5 == 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"ReadPrimAttrIdentifier");
            poVar6 = ::std::operator<<(poVar6,"():");
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x60b);
            ::std::operator<<(poVar6," ");
            pcVar9 = "PrimAttr name must not starts with number.";
            goto LAB_002b13df;
          }
        }
      }
    }
    piVar1 = &(this->_curr_cursor).col;
    *piVar1 = *piVar1 + 1;
    ::std::operator<<(local_1a8,c);
  }
  tok._M_dataplus._M_p = (pointer)&tok.field_2;
  tok._M_string_length = 0;
  tok.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string((string *)&c,"",(allocator *)&local_370);
  ::std::__cxx11::stringbuf::str();
  Path::Path((Path *)&ss_e,(string *)&c,&local_350);
  bVar4 = pathutil::ValidatePropPath((Path *)&ss_e,&tok);
  Path::~Path((Path *)&ss_e);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  if (bVar4) {
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    cVar2 = (_ss_e + -1)[(long)local_328];
    ::std::__cxx11::string::_M_dispose();
    if (cVar2 != '.') {
      ::std::__cxx11::stringbuf::str();
      bVar4 = contains(&tok,'.');
      if (bVar4) {
        ::std::__cxx11::string::string((string *)&ss_e,".connect",(allocator *)&local_350);
        bVar4 = endsWith(&tok,(string *)&ss_e);
        if (bVar4) {
          ::std::__cxx11::string::_M_dispose();
LAB_002b148f:
          sVar7 = counts(&tok,'.');
          if (sVar7 < 2) goto LAB_002b1538;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,"[ASCII]");
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReadPrimAttrIdentifier");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x638);
          ::std::operator<<(poVar6," ");
          pcVar9 = "Attribute identifier `{}` containing multiple `.` is not allowed.";
        }
        else {
          ::std::__cxx11::string::string((string *)&c,".timeSamples",(allocator *)&local_370);
          bVar4 = endsWith(&tok,(string *)&c);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (bVar4) goto LAB_002b148f;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,"[ASCII]");
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReadPrimAttrIdentifier");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x630);
          ::std::operator<<(poVar6," ");
          pcVar9 = "Must ends with `.connect` or `.timeSamples` for attrbute name: `{}`";
        }
        ::std::__cxx11::string::string((string *)&local_350,pcVar9,(allocator *)&local_370);
        fmt::format<std::__cxx11::string>((string *)&c,(fmt *)&local_350,(string *)&tok,local_328);
        poVar6 = ::std::operator<<((ostream *)&ss_e,(string *)&c);
        ::std::operator<<(poVar6,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&c);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        bVar4 = false;
      }
      else {
LAB_002b1538:
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)local_378,(string *)&ss_e);
        ::std::__cxx11::string::_M_dispose();
        bVar4 = true;
      }
      ::std::__cxx11::string::_M_dispose();
      goto LAB_002b1428;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"ReadPrimAttrIdentifier");
    poVar6 = ::std::operator<<(poVar6,"():");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x623);
    ::std::operator<<(poVar6," ");
    pcVar9 = "PrimAttr name must not ends with `.`\n";
LAB_002b13df:
    poVar6 = ::std::operator<<((ostream *)&ss_e,pcVar9);
    ::std::operator<<(poVar6,"\n");
    ::std::__cxx11::stringbuf::str();
    PushError(this,&tok);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,"[ASCII]");
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"ReadPrimAttrIdentifier");
    poVar6 = ::std::operator<<(poVar6,"():");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x61d);
    ::std::operator<<(poVar6," ");
    ::std::__cxx11::string::string((string *)&local_350,"Invalid Property name `{}`: {}",&local_3b9)
    ;
    ::std::__cxx11::stringbuf::str();
    fmt::format<std::__cxx11::string,std::__cxx11::string>
              ((string *)&c,(fmt *)&local_350,&local_370,&tok,in_R8);
    poVar6 = ::std::operator<<((ostream *)&ss_e,(string *)&c);
    ::std::operator<<(poVar6,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&c);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    ::std::__cxx11::string::_M_dispose();
  }
LAB_002b1426:
  bVar4 = false;
LAB_002b1428:
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return bVar4;
}

Assistant:

bool AsciiParser::ReadPrimAttrIdentifier(std::string *token) {
  // Example:
  // - xformOp:transform
  // - primvars:uvmap1

  std::stringstream ss;

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '_') {
      // ok
    } else if (c == ':') {  // namespace
      // ':' must lie in the middle of string literal
      if (ss.str().size() == 0) {
        PUSH_ERROR_AND_RETURN("PrimAttr name must not starts with `:`");
      }
    } else if (c == '.') {  // delimiter for `connect`
      // '.' must lie in the middle of string literal
      if (ss.str().size() == 0) {
        PUSH_ERROR_AND_RETURN("PrimAttr name must not starts with `.`");
      }
    } else if (std::isalnum(int(c))) {
      // number must not be allowed for the first char.
      if (ss.str().size() == 0) {
        if (!std::isalpha(int(c))) {
          PUSH_ERROR_AND_RETURN("PrimAttr name must not starts with number.");
        }
      }
    } else {
      _sr->seek_from_current(-1);
      break;
    }

    _curr_cursor.col++;

    ss << c;
  }

  {
    std::string name_err;
    if (!pathutil::ValidatePropPath(Path("", ss.str()), &name_err)) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii,
          fmt::format("Invalid Property name `{}`: {}", ss.str(), name_err));
    }
  }

  // '.' must lie in the middle of string literal
  if (ss.str().back() == '.') {
    PUSH_ERROR_AND_RETURN("PrimAttr name must not ends with `.`\n");
    return false;
  }

  std::string tok = ss.str();

  if (contains(tok, '.')) {
    if (endsWith(tok, ".connect") || endsWith(tok, ".timeSamples")) {
      // OK
    } else {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, fmt::format("Must ends with `.connect` or `.timeSamples` for "
                              "attrbute name: `{}`",
                              tok));
    }

    // Multiple `.` is not allowed(e.g. attr.connect.timeSamples)
    if (counts(tok, '.') > 1) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, fmt::format("Attribute identifier `{}` containing multiple "
                              "`.` is not allowed.",
                              tok));
    }
  }

  (*token) = ss.str();
  DCOUT("primAttr identifier = " << (*token));
  return true;
}